

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O0

CollectorResult __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::emit
          (ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this,void *args)

{
  bool bVar1;
  long *in_RDI;
  SignalLink *old;
  bool continue_emission;
  SignalLink *link;
  CollectorDefault<void> collector;
  SignalLink *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  SignalLink *this_00;
  CollectorDefault<void> local_11 [17];
  
  if (*in_RDI == 0) {
    CollectorDefault<void>::result(local_11);
  }
  else {
    this_00 = (SignalLink *)*in_RDI;
    SignalLink::incref(this_00);
    do {
      bVar1 = std::operator!=((function<void_(const_void_*)> *)in_stack_ffffffffffffffd0,in_RDI);
      if ((bVar1) &&
         (in_stack_ffffffffffffffdf =
               CollectorInvocation<Simple::Lib::CollectorDefault<void>,_void_(const_void_*)>::invoke
                         ((CollectorInvocation<Simple::Lib::CollectorDefault<void>,_void_(const_void_*)>
                           *)this_00,
                          (CollectorDefault<void> *)
                          CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                          (function<void_(const_void_*)> *)in_stack_ffffffffffffffd0,in_RDI),
         !(bool)in_stack_ffffffffffffffdf)) break;
      in_stack_ffffffffffffffd0 = this_00;
      this_00 = in_stack_ffffffffffffffd0->next;
      SignalLink::incref(this_00);
      SignalLink::decref(in_stack_ffffffffffffffd0);
    } while (this_00 != (SignalLink *)*in_RDI);
    SignalLink::decref(in_stack_ffffffffffffffd0);
    CollectorDefault<void>::result(local_11);
  }
  return;
}

Assistant:

CollectorResult emit(Args... args) {
    Collector collector;
    if (!callback_ring_) return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do {
      if (link->function != 0) {
        const bool continue_emission =
            this->invoke(collector, link->function, args...);
        if (!continue_emission) break;
      }
      SignalLink *old = link;
      link = old->next;
      link->incref();
      old->decref();
    } while (link != callback_ring_);
    link->decref();
    return collector.result();
  }